

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O1

void pzshape::TPZShapeTriang::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  uVar5 = 3;
  uVar6 = 4;
  lVar11 = 0;
  do {
    uVar8 = uVar5 / 3;
    lVar10 = lVar11 + uVar8 * -3 + 3;
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    uVar7 = uVar6 / 3;
    lVar9 = uVar7 * -3 + 4 + lVar11;
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = lVar11 + 3;
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar1) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    phi->fElem[lVar11 + 3] =
         phi->fElem[uVar8 * -3 + lVar11 + 3] * phi->fElem[uVar7 * -3 + lVar11 + 4];
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar3 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar4 * lVar1] =
         dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar10] *
         phi->fElem[uVar7 * -3 + lVar11 + 4] +
         phi->fElem[uVar8 * -3 + lVar11 + 3] * dphi->fElem[lVar3 * lVar9];
    if ((lVar4 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar3 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dphi->fElem[lVar1 * (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] =
         dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar10 + 1] *
         phi->fElem[uVar7 * -3 + lVar11 + 4] +
         phi->fElem[uVar8 * -3 + lVar11 + 3] * dphi->fElem[lVar9 * lVar3 + 1];
    lVar11 = lVar11 + 1;
    uVar6 = uVar6 + 1;
    uVar5 = uVar5 + 1;
  } while (lVar11 != 3);
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 7) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[6] = *phi->fElem * phi->fElem[1] * phi->fElem[2];
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar11 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar11 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 7)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar10 * 6] =
       *phi->fElem * phi->fElem[1] * dphi->fElem[lVar11 * 2] +
       *dphi->fElem * phi->fElem[1] * phi->fElem[2] +
       *phi->fElem * dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow] *
       phi->fElem[2];
  if ((lVar10 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar11 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((1 < lVar11) && (6 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 6 + 1] =
         *phi->fElem * phi->fElem[1] * dphi->fElem[lVar11 * 2 + 1] +
         dphi->fElem[1] * phi->fElem[1] * phi->fElem[2] +
         *phi->fElem * dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] *
         phi->fElem[2];
    lVar11 = 3;
    while( true ) {
      dVar2 = *(double *)(&DAT_0154d8d0 + lVar11 * 8);
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar11] = phi->fElem[lVar11] * dVar2;
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)) break;
      lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      lVar9 = lVar10 * lVar11;
      dphi->fElem[lVar9] = dphi->fElem[lVar9] * dVar2;
      if ((lVar10 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar11;
      dphi->fElem[lVar10 + 1] = dVar2 * dphi->fElem[lVar10 + 1];
      lVar11 = lVar11 + 1;
      if (lVar11 == 7) {
        return;
      }
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapeTriang::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		int is;
		for(is=3; is<6; is++)
		{
			int is1 = is%3;
			int is2 = (is+1)%3;
			phi(is,0) = phi(is1,0)*phi(is2,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
		}
		int is1 = 0;
		int is2 = 1;
		int is3 = 2;
		phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
		dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
		dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);

		// Make the generating shape functions linear and unitary
		REAL mult[] = {1.,1.,1.,4.,4.,4.,27.};
		for(is=3;is<NSides; is++)
		{
			phi(is,0) *= mult[is];
			dphi(0,is) *= mult[is];
			dphi(1,is) *= mult[is];
		}

		
	}